

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeZ.cpp
# Opt level: O1

void __thiscall OpenMD::ChargeZ::writeChargeZ(ChargeZ *this)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  char cVar6;
  double *pdVar7;
  double *pdVar8;
  ostream *poVar9;
  pointer pdVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  ofstream rdfStream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  pdVar4 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar16 = 0.0;
  dVar20 = 0.0;
  pdVar3 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar7 = pdVar3; pdVar7 != pdVar4; pdVar7 = pdVar7 + 1) {
    dVar20 = dVar20 + *pdVar7;
  }
  pdVar7 = (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar7 != pdVar5) {
    dVar16 = 0.0;
    pdVar8 = pdVar7;
    do {
      dVar16 = dVar16 + *pdVar8;
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar5);
  }
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    snprintf(painCave.errMsg,2000,"ChargeZ: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#ChargeZ ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection: (",0xd);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\tcharge\n",8);
    pdVar10 = (this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar11 = (long)(this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar10;
    if (lVar11 != 0) {
      lVar14 = (long)pdVar4 - (long)pdVar3;
      lVar15 = lVar14 >> 3;
      auVar17._8_4_ = (int)(lVar14 >> 0x23);
      auVar17._0_8_ = lVar15;
      auVar17._12_4_ = 0x45300000;
      lVar14 = (long)pdVar5 - (long)pdVar7 >> 3;
      auVar18._8_4_ = (int)((long)pdVar5 - (long)pdVar7 >> 0x23);
      auVar18._0_8_ = lVar14;
      auVar18._12_4_ = 0x45300000;
      dVar20 = dVar20 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0));
      uVar12 = lVar11 >> 3;
      uVar13 = 0;
      do {
        auVar21._8_4_ = (int)(uVar12 >> 0x20);
        auVar21._0_8_ = uVar12;
        auVar21._12_4_ = 0x45300000;
        lVar11 = (long)(this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
        dVar1 = pdVar10[uVar13];
        iVar2 = this->nProcessed_;
        poVar9 = std::ostream::_M_insert<double>
                           ((((double)uVar13 + 0.5) * dVar20) /
                            ((auVar21._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
        lVar15 = lVar11 >> 3;
        auVar19._8_4_ = (int)(lVar11 >> 0x23);
        auVar19._0_8_ = lVar15;
        auVar19._12_4_ = 0x45300000;
        poVar9 = std::ostream::_M_insert<double>
                           (dVar1 / ((((dVar16 / ((auVar18._8_8_ - 1.9342813113834067e+25) +
                                                 ((double)CONCAT44(0x43300000,(int)lVar14) -
                                                 4503599627370496.0))) * dVar20) /
                                     ((auVar19._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)
                                     )) * (double)iVar2));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        uVar13 = (ulong)((int)uVar13 + 1);
        pdVar10 = (this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = (long)(this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
      } while (uVar13 < uVar12);
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ChargeZ::writeChargeZ() {
    // compute average box length:
    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    RealType areaSum = 0.0;
    for (j = areas_.begin(); j != areas_.end(); ++j) {
      areaSum += *j;
    }
    RealType areaAve = areaSum / areas_.size();

    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#ChargeZ "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#" << axisLabel_ << "\tcharge\n";
      RealType binCharge;
      for (unsigned int i = 0; i < chargeZ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / chargeZ_.size();

        RealType volSlice = areaAve * zAve / zBox_.size();

        binCharge = chargeZ_[i] / (volSlice * nProcessed_);

        rdfStream << z << "\t" << binCharge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ChargeZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }